

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::DefineDirectiveSyntax::setChild
          (DefineDirectiveSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  MacroFormalArgumentListSyntax *pMVar2;
  SyntaxNode *pSVar3;
  TokenList *pTVar4;
  logic_error *this_00;
  Token TVar5;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 4) {
    switch(index) {
    case 0:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->super_DirectiveSyntax).directive.kind = TVar5.kind;
      (this->super_DirectiveSyntax).directive.field_0x2 = TVar5._2_1_;
      (this->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->super_DirectiveSyntax).directive.rawLen = TVar5.rawLen;
      (this->super_DirectiveSyntax).directive.info = TVar5.info;
      break;
    case 1:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->name).kind = TVar5.kind;
      (this->name).field_0x2 = TVar5._2_1_;
      (this->name).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->name).rawLen = TVar5.rawLen;
      (this->name).info = TVar5.info;
      break;
    case 2:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        pMVar2 = (MacroFormalArgumentListSyntax *)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        pMVar2 = SyntaxNode::as<slang::syntax::MacroFormalArgumentListSyntax>(pSVar3);
      }
      this->formalArguments = pMVar2;
      break;
    case 3:
      pSVar3 = TokenOrSyntax::node(&child);
      pTVar4 = SyntaxNode::as<slang::syntax::TokenList>(pSVar3);
      (this->body).super_SyntaxListBase.super_SyntaxNode.parent =
           (pTVar4->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->body).super_SyntaxListBase.super_SyntaxNode.kind =
           (pTVar4->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->body).super_SyntaxListBase.childCount = (pTVar4->super_SyntaxListBase).childCount;
      sVar1 = (pTVar4->super_span<slang::parsing::Token,_18446744073709551615UL>).size_;
      (this->body).super_span<slang::parsing::Token,_18446744073709551615UL>.data_ =
           (pTVar4->super_span<slang::parsing::Token,_18446744073709551615UL>).data_;
      (this->body).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ = sVar1;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_d8,0x101e);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void DefineDirectiveSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: directive = child.token(); return;
        case 1: name = child.token(); return;
        case 2: formalArguments = child.node() ? &child.node()->as<MacroFormalArgumentListSyntax>() : nullptr; return;
        case 3: body = child.node()->as<TokenList>(); return;
        default: ASSUME_UNREACHABLE;
    }
}